

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O0

exr_result_t generic_unpack_deep(exr_decode_pipeline_t *decode)

{
  short sVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint16_t uVar5;
  int iVar6;
  float fVar7;
  uint32_t ui;
  long lVar8;
  long *in_RDI;
  bool bVar9;
  int s_8;
  uint32_t *src_8;
  uint32_t fint_3;
  int s_7;
  uint32_t *src_7;
  uint32_t fint_2;
  int s_6;
  uint32_t *src_6;
  uint32_t fint_1;
  int s_5;
  uint32_t *src_5;
  int s_4;
  uint32_t *src_4;
  uint32_t fint;
  int s_3;
  uint32_t *src_3;
  uint16_t cval_1;
  int s_2;
  uint16_t *src_2;
  uint16_t cval;
  int s_1;
  uint16_t *src_1;
  int s;
  uint16_t *src;
  int32_t tmp;
  int32_t samps;
  int x_1;
  int x;
  int incr_tot;
  int32_t prevsamps;
  exr_coding_channel_info_t *decc;
  int c;
  int y;
  size_t totsamps;
  int ubpc;
  int bpc;
  int h;
  int w;
  uint8_t *cdata;
  int32_t *sampbuffer;
  uint8_t *srcbuffer;
  uint in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff04;
  int local_f4;
  int local_e4;
  int local_d4;
  int local_c4;
  int local_b4;
  int local_a4;
  int local_94;
  int local_84;
  int local_74;
  int local_64;
  int local_60;
  int local_5c;
  int local_54;
  int local_48;
  int local_44;
  long local_40;
  float *local_28;
  long local_20;
  
  local_20 = in_RDI[0x12];
  local_40 = 0;
  iVar2 = (int)in_RDI[5];
  iVar3 = *(int *)((long)in_RDI + 0x24);
  local_44 = 0;
  do {
    if (iVar3 <= local_44) {
      return 0;
    }
    for (local_48 = 0; local_48 < (short)in_RDI[1]; local_48 = local_48 + 1) {
      lVar8 = *in_RDI + (long)local_48 * 0x30;
      local_54 = 0;
      bVar9 = local_48 + 1 == (int)(short)in_RDI[1];
      iVar6 = (int)*(short *)(lVar8 + 0x1c);
      if (*(long *)(lVar8 + 0x28) == 0) {
        local_54 = 0;
        if ((*(ushort *)((long)in_RDI + 10) & 1) == 0) {
          local_54 = *(int *)(local_20 + (long)(iVar2 + -1) * 4);
        }
        else {
          for (local_5c = 0; local_5c < iVar2; local_5c = local_5c + 1) {
            local_54 = *(int *)(local_20 + (long)local_5c * 4) + local_54;
          }
        }
        if (bVar9) {
          local_40 = local_54 + local_40;
        }
      }
      else {
        local_28 = (float *)(local_40 * iVar6 + *(long *)(lVar8 + 0x28));
        for (local_60 = 0; local_60 < iVar2; local_60 = local_60 + 1) {
          iVar4 = *(int *)(local_20 + (long)local_60 * 4);
          local_64 = iVar4;
          if ((*(ushort *)((long)in_RDI + 10) & 1) == 0) {
            local_64 = iVar4 - local_54;
            local_54 = iVar4;
          }
          sVar1 = *(short *)(lVar8 + 0x1a);
          if (sVar1 == 0) {
            sVar1 = *(short *)(lVar8 + 0x1e);
            if (sVar1 == 0) {
              for (local_f4 = 0; local_f4 < local_64; local_f4 = local_f4 + 1) {
                fVar7 = (float)unaligned_load32((void *)CONCAT44(in_stack_ffffffffffffff04,
                                                                 in_stack_ffffffffffffff00));
                *local_28 = fVar7;
                local_28 = (float *)((long)local_28 + (long)iVar6);
              }
            }
            else if (sVar1 == 1) {
              for (local_d4 = 0; local_d4 < local_64; local_d4 = local_d4 + 1) {
                unaligned_load32((void *)CONCAT44(in_stack_ffffffffffffff04,
                                                  in_stack_ffffffffffffff00));
                uVar5 = uint_to_half(0x1521e3);
                *(uint16_t *)local_28 = uVar5;
                local_28 = (float *)((long)local_28 + (long)iVar6);
              }
            }
            else {
              if (sVar1 != 2) {
                return 3;
              }
              for (local_e4 = 0; local_e4 < local_64; local_e4 = local_e4 + 1) {
                ui = unaligned_load32((void *)CONCAT44(in_stack_ffffffffffffff04,
                                                       in_stack_ffffffffffffff00));
                fVar7 = uint_to_float(ui);
                *local_28 = fVar7;
                local_28 = (float *)((long)local_28 + (long)iVar6);
              }
            }
          }
          else if (sVar1 == 1) {
            in_stack_ffffffffffffff04 = (uint)*(ushort *)(lVar8 + 0x1e);
            if (in_stack_ffffffffffffff04 == 0) {
              for (local_94 = 0; local_94 < local_64; local_94 = local_94 + 1) {
                unaligned_load16((void *)CONCAT44(in_stack_ffffffffffffff04,
                                                  in_stack_ffffffffffffff00));
                fVar7 = (float)half_to_uint(0x15);
                *local_28 = fVar7;
                local_28 = (float *)((long)local_28 + (long)iVar6);
              }
            }
            else if (in_stack_ffffffffffffff04 == 1) {
              for (local_74 = 0; local_74 < local_64; local_74 = local_74 + 1) {
                uVar5 = unaligned_load16((void *)CONCAT44(in_stack_ffffffffffffff04,
                                                          in_stack_ffffffffffffff00));
                *(uint16_t *)local_28 = uVar5;
                local_28 = (float *)((long)local_28 + (long)iVar6);
              }
            }
            else {
              if (in_stack_ffffffffffffff04 != 2) {
                return 3;
              }
              for (local_84 = 0; local_84 < local_64; local_84 = local_84 + 1) {
                uVar5 = unaligned_load16((void *)CONCAT44(in_stack_ffffffffffffff04,
                                                          in_stack_ffffffffffffff00));
                fVar7 = half_to_float(uVar5);
                *local_28 = fVar7;
                local_28 = (float *)((long)local_28 + (long)iVar6);
              }
            }
          }
          else {
            if (sVar1 != 2) {
              return 3;
            }
            in_stack_ffffffffffffff00 = (uint)*(ushort *)(lVar8 + 0x1e);
            if (in_stack_ffffffffffffff00 == 0) {
              for (local_c4 = 0; local_c4 < local_64; local_c4 = local_c4 + 1) {
                unaligned_load32((void *)CONCAT44(in_stack_ffffffffffffff04,
                                                  in_stack_ffffffffffffff00));
                fVar7 = (float)float_to_uint_int(0);
                *local_28 = fVar7;
                local_28 = (float *)((long)local_28 + (long)iVar6);
              }
            }
            else if (in_stack_ffffffffffffff00 == 1) {
              for (local_a4 = 0; local_a4 < local_64; local_a4 = local_a4 + 1) {
                unaligned_load32((void *)CONCAT44(in_stack_ffffffffffffff04,
                                                  in_stack_ffffffffffffff00));
                uVar5 = float_to_half_int(0);
                *(uint16_t *)local_28 = uVar5;
                local_28 = (float *)((long)local_28 + (long)iVar6);
              }
            }
            else {
              if (in_stack_ffffffffffffff00 != 2) {
                return 3;
              }
              for (local_b4 = 0; local_b4 < local_64; local_b4 = local_b4 + 1) {
                fVar7 = (float)unaligned_load32((void *)CONCAT44(in_stack_ffffffffffffff04,
                                                                 in_stack_ffffffffffffff00));
                *local_28 = fVar7;
                local_28 = (float *)((long)local_28 + (long)iVar6);
              }
            }
          }
          if (bVar9) {
            local_40 = local_64 + local_40;
          }
        }
      }
    }
    local_20 = local_20 + (long)iVar2 * 4;
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

static exr_result_t
generic_unpack_deep (exr_decode_pipeline_t* decode)
{
    const uint8_t* srcbuffer  = (const uint8_t*) decode->unpacked_buffer;
    const int32_t* sampbuffer = decode->sample_count_table;
    uint8_t*       cdata;
    int            w, h, bpc, ubpc;
    size_t         totsamps = 0;

    w = decode->chunk.width;
    h = decode->chunk.height;

    for (int y = 0; y < h; ++y)
    {
        for (int c = 0; c < decode->channel_count; ++c)
        {
            exr_coding_channel_info_t* decc      = (decode->channels + c);
            int32_t                    prevsamps = 0;

            int incr_tot = ((c + 1) == decode->channel_count);

            bpc   = decc->bytes_per_element;
            ubpc  = decc->user_bytes_per_element;
            cdata = decc->decode_to_ptr;

            if (!cdata)
            {
                prevsamps = 0;
                if ((decode->decode_flags &
                     EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL))
                {
                    for (int x = 0; x < w; ++x)
                        prevsamps += sampbuffer[x];
                }
                else
                    prevsamps = sampbuffer[w - 1];
                srcbuffer += ((size_t) bpc) * ((size_t) prevsamps);

                if (incr_tot) totsamps += (size_t) prevsamps;

                continue;
            }
            cdata += totsamps * ((size_t) ubpc);

            for (int x = 0; x < w; ++x)
            {
                int32_t samps = sampbuffer[x];
                if (0 == (decode->decode_flags &
                          EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL))
                {
                    int32_t tmp = samps - prevsamps;
                    prevsamps   = samps;
                    samps       = tmp;
                }

                UNPACK_SAMPLES (samps)

                srcbuffer += bpc * samps;
                if (incr_tot) totsamps += (size_t) samps;
            }
        }
        sampbuffer += w;
    }

    return EXR_ERR_SUCCESS;
}